

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

HighsModelStatus __thiscall
presolve::HPresolve::run(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  bool bVar1;
  Result RVar2;
  HighsInt HVar3;
  pointer pHVar4;
  reference piVar5;
  double *pdVar6;
  size_type sVar7;
  reference pvVar8;
  reference pvVar9;
  uint *puVar10;
  size_t sVar11;
  undefined4 uVar12;
  undefined8 *in_RSI;
  HPresolve *in_RDI;
  bool in_stack_0000005c;
  bool in_stack_0000005d;
  bool in_stack_0000005e;
  bool in_stack_0000005f;
  double in_stack_00000060;
  HighsInt in_stack_0000006c;
  double *in_stack_00000070;
  HighsInt *in_stack_00000078;
  HighsMipSolver *in_stack_00000080;
  HighsCutPool *in_stack_00000088;
  HighsInt j_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<int,_std::allocator<int>_> *__range4_1;
  HighsInt j;
  iterator __end4;
  iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  HighsInt i;
  HighsInt numcuts;
  vector<double,_std::allocator<double>_> cutvals;
  vector<int,_std::allocator<int>_> cutinds;
  anon_class_16_2_81da6f95 reportReductions;
  HighsPostsolveStack *in_stack_00000c98;
  HPresolve *in_stack_00000ca0;
  undefined4 in_stack_fffffffffffffeb8;
  HighsInt in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  HighsDomain *in_stack_fffffffffffffed0;
  double dVar13;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  HighsCutPool *in_stack_fffffffffffffee0;
  size_type in_stack_fffffffffffffee8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff00;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff08;
  value_type in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  uint in_stack_ffffffffffffff18;
  HighsInt in_stack_ffffffffffffff1c;
  HPresolve *in_stack_ffffffffffffff20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a0;
  vector<int,_std::allocator<int>_> *local_98;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  vector<int,_std::allocator<int>_> *local_78;
  int local_6c;
  int local_68;
  double in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  HighsInt in_stack_ffffffffffffffb4;
  HPresolve *in_stack_ffffffffffffffb8;
  HighsModelStatus local_4;
  
  in_RDI->presolve_status_ = kNotSet;
  in_RDI->shrinkProblemEnabled = true;
  *in_RSI = 0;
  in_RSI[1] = 0;
  in_RSI[2] = 0;
  in_RSI[3] = 0;
  in_RSI[4] = 0;
  RVar2 = presolve(in_stack_ffffffffffffffb8,
                   (HighsPostsolveStack *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  switch(RVar2) {
  case kOk:
  case kStopped:
    break;
  case kPrimalInfeasible:
    in_RDI->presolve_status_ = kInfeasible;
    run::anon_class_16_2_81da6f95::operator()((anon_class_16_2_81da6f95 *)in_stack_fffffffffffffed0)
    ;
    return kInfeasible;
  case kDualInfeasible:
    in_RDI->presolve_status_ = kUnboundedOrInfeasible;
    run::anon_class_16_2_81da6f95::operator()((anon_class_16_2_81da6f95 *)in_stack_fffffffffffffed0)
    ;
    return kUnboundedOrInfeasible;
  }
  run::anon_class_16_2_81da6f95::operator()((anon_class_16_2_81da6f95 *)in_stack_fffffffffffffed0);
  shrinkProblem(in_stack_00000ca0,in_stack_00000c98);
  if (in_RDI->mipsolver != (HighsMipSolver *)0x0) {
    pHVar4 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x712b20);
    HighsCliqueTable::setPresolveFlag(&pHVar4->cliquetable,false);
    pHVar4 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x712b49);
    HVar3 = numNonzeros((HPresolve *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    HighsCliqueTable::setMaxEntries(&pHVar4->cliquetable,HVar3);
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x712b85)
    ;
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x712bac)
    ;
    HighsDomain::addCutpool
              (in_stack_fffffffffffffed0,
               (HighsCutPool *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x712bd5)
    ;
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x712bff)
    ;
    HighsDomain::addConflictPool
              (in_stack_fffffffffffffed0,
               (HighsConflictPool *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    pHVar4 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x712c2e);
    if (pHVar4->numRestarts != 0) {
      in_stack_ffffffffffffff20 = (HPresolve *)&stack0xffffffffffffffc0;
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x712c4d);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x712c5a);
      std::vector<int,_std::allocator<int>_>::reserve
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffef0,
                 in_stack_fffffffffffffee8);
      std::vector<double,_std::allocator<double>_>::reserve
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      local_68 = 0;
      local_6c = in_RDI->model->num_row_;
      while ((local_6c = local_6c + -1, -1 < local_6c &&
             (in_stack_ffffffffffffff1c =
                   HighsPostsolveStack::getOrigRowIndex
                             ((HighsPostsolveStack *)
                              CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                              in_stack_fffffffffffffebc),
             in_RDI->mipsolver->orig_model_->num_row_ <= in_stack_ffffffffffffff1c))) {
        local_68 = local_68 + 1;
        storeRow((HPresolve *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 in_stack_fffffffffffffebc);
        std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x712d60)
        ;
        std::vector<double,_std::allocator<double>_>::clear
                  ((vector<double,_std::allocator<double>_> *)0x712d6d);
        local_78 = &in_RDI->rowpositions;
        local_80._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)
                               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        std::vector<int,_std::allocator<int>_>::end
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                  (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)),
              bVar1) {
          piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_80);
          in_stack_ffffffffffffff74 = *piVar5;
          std::vector<int,_std::allocator<int>_>::operator[]
                    (&in_RDI->Acol,(long)in_stack_ffffffffffffff74);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0,
                     (value_type_conflict2 *)
                     CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          std::vector<double,_std::allocator<double>_>::operator[]
                    (&in_RDI->Avalue,(long)in_stack_ffffffffffffff74);
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0,
                     (value_type_conflict1 *)
                     CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_80);
        }
        pHVar4 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x712e63);
        in_stack_fffffffffffffee0 = &pHVar4->cutpool;
        std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x712e8d);
        pdVar6 = std::vector<double,_std::allocator<double>_>::data
                           ((vector<double,_std::allocator<double>_> *)0x712e9f);
        HVar3 = (HighsInt)((ulong)pdVar6 >> 0x20);
        sVar7 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffc0);
        uVar12 = (undefined4)sVar7;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->model->row_upper_,(long)local_6c);
        in_stack_ffffffffffffff08 = (vector<int,_std::allocator<int>_> *)*pvVar8;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&in_RDI->rowsizeInteger,(long)local_6c);
        in_stack_ffffffffffffff10 = *pvVar9;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&in_RDI->rowsizeImplInt,(long)local_6c);
        in_stack_ffffffffffffff14 = in_stack_ffffffffffffff10 + *pvVar9;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->rowsize,(long)local_6c)
        ;
        in_stack_ffffffffffffff18 = in_stack_ffffffffffffff18 & 0xffffff;
        if (in_stack_ffffffffffffff14 == *pvVar9) {
          in_stack_fffffffffffffedf =
               rowCoefficientsIntegral
                         (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                          in_stack_ffffffffffffffa8);
          in_stack_ffffffffffffff18 =
               CONCAT13(in_stack_fffffffffffffedf,(int3)in_stack_ffffffffffffff18);
        }
        in_stack_fffffffffffffec8 = 0;
        in_stack_fffffffffffffec0 = 0;
        in_stack_fffffffffffffeb8 = 1;
        HighsCutPool::addCut
                  (in_stack_00000088,in_stack_00000080,in_stack_00000078,in_stack_00000070,
                   in_stack_0000006c,in_stack_00000060,in_stack_0000005f,in_stack_0000005e,
                   in_stack_0000005d,in_stack_0000005c);
        markRowDeleted((HPresolve *)CONCAT44(uVar12,in_stack_ffffffffffffff00),HVar3);
        local_98 = &in_RDI->rowpositions;
        local_a0._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)
                               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        std::vector<int,_std::allocator<int>_>::end
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                  (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)),
              bVar1) {
          puVar10 = (uint *)__gnu_cxx::
                            __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                            operator*(&local_a0);
          unlink(in_RDI,(char *)(ulong)*puVar10);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_a0);
        }
      }
      in_RDI->model->num_row_ = in_RDI->model->num_row_ - local_68;
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffee0,
                 CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffee0,
                 CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffee0,
               CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0);
    }
  }
  toCSC(in_stack_ffffffffffffff20,
        (vector<double,_std::allocator<double>_> *)
        CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
        (vector<int,_std::allocator<int>_> *)
        CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),in_stack_ffffffffffffff08);
  if (in_RDI->model->num_col_ == 0) {
    if (in_RDI->mipsolver == (HighsMipSolver *)0x0) {
      if (in_RDI->model->num_row_ != 0) {
        in_RDI->presolve_status_ = kNotPresolved;
        return kMin;
      }
    }
    else {
      dVar13 = in_RDI->model->offset_;
      pHVar4 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x7131a3);
      if (pHVar4->upper_limit <= dVar13 && dVar13 != pHVar4->upper_limit) {
        in_RDI->presolve_status_ = kInfeasible;
        return kInfeasible;
      }
      pHVar4 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x7131ed);
      pHVar4->lower_bound = 0.0;
    }
    in_RDI->presolve_status_ = kReducedToEmpty;
    local_4 = kOptimal;
  }
  else {
    sVar11 = HighsPostsolveStack::numReductions((HighsPostsolveStack *)0x71325b);
    if (sVar11 == 0) {
      in_RDI->presolve_status_ = kNotReduced;
    }
    else {
      in_RDI->presolve_status_ = kReduced;
    }
    if ((in_RDI->mipsolver == (HighsMipSolver *)0x0) &&
       (((in_RDI->options->super_HighsOptionsStruct).use_implied_bounds_from_presolve & 1U) != 0)) {
      setRelaxedImpliedBounds
                ((HPresolve *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    }
    local_4 = kMin;
  }
  return local_4;
}

Assistant:

HighsModelStatus HPresolve::run(HighsPostsolveStack& postsolve_stack) {
  presolve_status_ = HighsPresolveStatus::kNotSet;
  shrinkProblemEnabled = true;
  postsolve_stack.debug_prev_numreductions = 0;
  postsolve_stack.debug_prev_col_lower = 0;
  postsolve_stack.debug_prev_col_upper = 0;
  postsolve_stack.debug_prev_row_lower = 0;
  postsolve_stack.debug_prev_row_upper = 0;
  // Presolve should only be called with a model that has a non-empty
  // constraint matrix unless it has no rows
  assert(model->a_matrix_.numNz() || model->num_row_ == 0);
  auto reportReductions = [&]() {
    if (options->presolve != kHighsOffString &&
        reductionLimit < kHighsSize_tInf) {
      highsLogUser(options->log_options, HighsLogType::kInfo,
                   "Presolve performed %" PRId64 " of %" PRId64
                   " permitted reductions\n",
                   postsolve_stack.numReductions(), reductionLimit);
    }
  };
  switch (presolve(postsolve_stack)) {
    case Result::kStopped:
    case Result::kOk:
      break;
    case Result::kPrimalInfeasible:
      presolve_status_ = HighsPresolveStatus::kInfeasible;
      reportReductions();
      return HighsModelStatus::kInfeasible;
    case Result::kDualInfeasible:
      presolve_status_ = HighsPresolveStatus::kUnboundedOrInfeasible;
      reportReductions();
      return HighsModelStatus::kUnboundedOrInfeasible;
  }
  reportReductions();

  shrinkProblem(postsolve_stack);

  if (mipsolver != nullptr) {
    mipsolver->mipdata_->cliquetable.setPresolveFlag(false);
    mipsolver->mipdata_->cliquetable.setMaxEntries(numNonzeros());
    mipsolver->mipdata_->domain.addCutpool(mipsolver->mipdata_->cutpool);
    mipsolver->mipdata_->domain.addConflictPool(
        mipsolver->mipdata_->conflictPool);

    if (mipsolver->mipdata_->numRestarts != 0) {
      std::vector<HighsInt> cutinds;
      std::vector<double> cutvals;
      cutinds.reserve(model->num_col_);
      cutvals.reserve(model->num_col_);
      HighsInt numcuts = 0;
      for (HighsInt i = model->num_row_ - 1; i >= 0; --i) {
        // check if we already reached the original rows
        if (postsolve_stack.getOrigRowIndex(i) <
            mipsolver->orig_model_->num_row_)
          break;

        // row is a cut, remove it from matrix but add to cutpool
        ++numcuts;
        storeRow(i);
        cutinds.clear();
        cutvals.clear();
        for (HighsInt j : rowpositions) {
          cutinds.push_back(Acol[j]);
          cutvals.push_back(Avalue[j]);
        }

        mipsolver->mipdata_->cutpool.addCut(
            *mipsolver, cutinds.data(), cutvals.data(), cutinds.size(),
            model->row_upper_[i],
            rowsizeInteger[i] + rowsizeImplInt[i] == rowsize[i] &&
                rowCoefficientsIntegral(i, 1.0),
            true, false, false);

        markRowDeleted(i);
        for (HighsInt j : rowpositions) unlink(j);
      }

      model->num_row_ -= numcuts;
      model->row_lower_.resize(model->num_row_);
      model->row_upper_.resize(model->num_row_);
      model->row_names_.resize(model->num_row_);
    }
  }

  toCSC(model->a_matrix_.value_, model->a_matrix_.index_,
        model->a_matrix_.start_);

  if (model->num_col_ == 0) {
    // Reduced to empty
    if (mipsolver) {
      if (model->offset_ > mipsolver->mipdata_->upper_limit) {
        presolve_status_ = HighsPresolveStatus::kInfeasible;
        return HighsModelStatus::kInfeasible;
      }
      mipsolver->mipdata_->lower_bound = 0;
    } else {
      assert(model->num_row_ == 0);
      if (model->num_row_ != 0) {
        presolve_status_ = HighsPresolveStatus::kNotPresolved;
        return HighsModelStatus::kNotset;
      }
    }
    presolve_status_ = HighsPresolveStatus::kReducedToEmpty;
    return HighsModelStatus::kOptimal;
  } else if (postsolve_stack.numReductions() > 0) {
    // Reductions performed
    presolve_status_ = HighsPresolveStatus::kReduced;
  } else {
    // No reductions performed
    presolve_status_ = HighsPresolveStatus::kNotReduced;
  }

  if (!mipsolver && options->use_implied_bounds_from_presolve)
    setRelaxedImpliedBounds();

  assert(presolve_status_ != HighsPresolveStatus::kNotSet);
  return HighsModelStatus::kNotset;
}